

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall
TSMuxer::finishFileBlock
          (TSMuxer *this,int64_t newPts,int64_t newPCR,bool doChangeFile,bool recursive)

{
  pointer this_00;
  uint8_t *puVar1;
  bool bVar2;
  value_type_conflict3 local_3c;
  pointer local_30;
  int64_t gapForPATPMT;
  bool recursive_local;
  int64_t iStack_20;
  bool doChangeFile_local;
  int64_t newPCR_local;
  int64_t newPts_local;
  TSMuxer *this_local;
  
  gapForPATPMT._6_1_ = recursive;
  gapForPATPMT._7_1_ = doChangeFile;
  iStack_20 = newPCR;
  newPCR_local = newPts;
  newPts_local = (int64_t)this;
  if (0 < this->m_processedBlockSize) {
    local_30 = (pointer)0x250;
    doFlush(this,newPCR,0x250);
    if ((gapForPATPMT._7_1_ & 1) == 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::rbegin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&stack0xffffffffffffffc8);
      this_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                              *)&stack0xffffffffffffffc8);
      local_3c = (value_type_conflict3)(this->m_processedBlockSize / 0xc0);
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_3c);
    }
    this->m_processedBlockSize = 0;
    MuxerManager::muxBlockFinished((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer);
    if ((this->m_m2tsMode & 1U) == 0) {
      flushTSBuffer(this);
    }
    else {
      bVar2 = false;
      if (this->m_outBuf == (uint8_t *)0x0) {
        bVar2 = this->m_outBufLen == 0;
      }
      if (!bVar2) {
        __assert_fail("m_outBuf == nullptr && m_outBufLen == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                      ,0x382,
                      "void TSMuxer::finishFileBlock(const int64_t, const int64_t, const bool, const bool)"
                     );
      }
    }
    puVar1 = (uint8_t *)operator_new__((long)(this->m_writeBlockSize + 0x400));
    this->m_outBuf = puVar1;
    this->m_prevM2TSPCROffset = 0;
  }
  if ((gapForPATPMT._7_1_ & 1) != 0) {
    gotoNextFile(this,newPCR_local);
  }
  writePATPMT(this,iStack_20,true);
  writePCR(this,iStack_20);
  if ((this->m_sublingMuxer != (TSMuxer *)0x0) && ((gapForPATPMT._6_1_ & 1) != 0)) {
    finishFileBlock(this->m_sublingMuxer,newPCR_local,iStack_20,(bool)(gapForPATPMT._7_1_ & 1),false
                   );
  }
  return;
}

Assistant:

void TSMuxer::finishFileBlock(const int64_t newPts, const int64_t newPCR, const bool doChangeFile, const bool recursive)
{
    if (m_processedBlockSize > 0)
    {
        constexpr auto gapForPATPMT = static_cast<int64_t>((192 * 4.0) / 35000000.0 * 27000000.0);
        doFlush(newPCR, gapForPATPMT);
        if (!doChangeFile)
            m_interleaveInfo.rbegin()->push_back(static_cast<int32_t>(m_processedBlockSize / 192));
        m_processedBlockSize = 0;
        m_owner->muxBlockFinished(this);
        if (m_m2tsMode)
            assert(m_outBuf == nullptr && m_outBufLen == 0);
        else
            flushTSBuffer();
        m_outBuf = new uint8_t[m_writeBlockSize + 1024];
        m_prevM2TSPCROffset = 0;
    }

    if (doChangeFile)
        gotoNextFile(newPts);

    writePATPMT(newPCR, true);
    writePCR(newPCR);

    if (m_sublingMuxer && recursive)
        m_sublingMuxer->finishFileBlock(newPts, newPCR, doChangeFile, false);
}